

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# executor.cpp
# Opt level: O0

void __thiscall Executor::runThread(Executor *this)

{
  bool bVar1;
  reference __x;
  undefined1 local_40 [8];
  unique_lock<std::mutex> lock;
  Task task;
  Executor *this_local;
  
  while (((this->closed ^ 0xffU) & 1) != 0) {
    std::function<void_()>::function((function<void_()> *)&lock._M_owns);
    std::unique_lock<std::mutex>::unique_lock((unique_lock<std::mutex> *)local_40,&this->mutex);
    bVar1 = std::__cxx11::list<std::function<void_()>,_std::allocator<std::function<void_()>_>_>::
            empty(&this->pendingTasks);
    if (bVar1) {
      std::condition_variable::wait((unique_lock *)&this->notification);
    }
    else {
      __x = std::__cxx11::list<std::function<void_()>,_std::allocator<std::function<void_()>_>_>::
            front(&this->pendingTasks);
      std::function<void_()>::operator=((function<void_()> *)&lock._M_owns,__x);
      std::__cxx11::list<std::function<void_()>,_std::allocator<std::function<void_()>_>_>::
      pop_front(&this->pendingTasks);
    }
    std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)local_40);
    if (!bVar1) {
      std::function<void_()>::operator()((function<void_()> *)&lock._M_owns);
    }
    std::function<void_()>::~function((function<void_()> *)&lock._M_owns);
  }
  return;
}

Assistant:

void Executor::runThread() {
    while (!closed) {
        Task task;

        {
            std::unique_lock<std::mutex> lock(mutex);

            if (pendingTasks.empty()) {
                notification.wait(lock);
                continue;
            } else {
                task = pendingTasks.front();
                pendingTasks.pop_front();
            }
        }

        task();
    }
}